

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ypspur-interpreter.c
# Opt level: O2

int proc_spur(char *line,int *coordinate)

{
  int iVar1;
  char *line_00;
  char *toksave;
  
  iVar1 = 0;
  do {
    line_00 = strtok_r(line,";\n\r",&toksave);
    if (line_00 == (char *)0x0) {
      return iVar1;
    }
    iVar1 = proc_spur_cmd(line_00,coordinate);
    line = (char *)0x0;
  } while (-1 < iVar1);
  return -1;
}

Assistant:

int proc_spur(char* line, int* coordinate)
{
  char* line_div;
  char* toksave;
  int ret;

  ret = 0;
  line_div = strtok_r(line, ";\n\r", &toksave);
  while (line_div)
  {
    ret = proc_spur_cmd(line_div, coordinate);
    if (ret < 0)
    {
      break;
    }
    line_div = strtok_r(NULL, ";\n\r", &toksave);
  }
  return ret;
}